

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

Moves * __thiscall Position::GetCaptures(Position *this)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  Move *move;
  iterator __end2;
  iterator __begin2;
  Moves *__range2;
  Position *this_local;
  
  bVar1 = Moves::IsEmpty(&this->m_Captures);
  if (bVar1) {
    bVar1 = Moves::IsEmpty(&this->m_Moves);
    if (bVar1) {
      GenerateMoves(this);
    }
    __end2 = Moves::begin(&this->m_Moves);
    move = (Move *)Moves::end(&this->m_Moves);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>
                                       *)&move), bVar1) {
      this_00 = __gnu_cxx::__normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>::
                operator*(&__end2);
      iVar2 = Move::Score(this_00);
      if (iVar2 < 1) break;
      Moves::Add(&this->m_Captures,this_00);
      __gnu_cxx::__normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>::operator++
                (&__end2);
    }
  }
  return &this->m_Captures;
}

Assistant:

const Moves &GetCaptures()
    {
        if ( m_Captures.IsEmpty() )
        {
            if ( m_Moves.IsEmpty() )
                GenerateMoves();

            for ( auto &move : m_Moves )
            {
                if ( move.Score() > 0 )
                    m_Captures.Add( move );
                else
                    break;
            }
        }

        return m_Captures;
    }